

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O3

void Assimp::FBX::Util::DOMWarning(string *message,Element *element)

{
  Logger *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (element != (Element *)0x0) {
    DOMWarning(message,element->key_token);
    return;
  }
  pLVar1 = DefaultLogger::get();
  if (pLVar1 != (Logger *)0x0) {
    pLVar1 = DefaultLogger::get();
    std::operator+(&local_38,"FBX-DOM: ",message);
    Logger::warn(pLVar1,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DOMWarning(const std::string& message, const Element* element /*= NULL*/)
{
    if(element) {
        DOMWarning(message,element->KeyToken());
        return;
    }
    if(DefaultLogger::get()) {
        ASSIMP_LOG_WARN("FBX-DOM: " + message);
    }
}